

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.h
# Opt level: O2

int secp256k1_musig_nonce_gen
              (secp256k1_context *ctx,secp256k1_musig_secnonce *secnonce,
              secp256k1_musig_pubnonce *pubnonce,uchar *session_secrand32,uchar *seckey,
              secp256k1_pubkey *pubkey,uchar *msg32,secp256k1_musig_keyagg_cache *keyagg_cache,
              uchar *extra_input32)

{
  uint uVar1;
  uint local_3c;
  secp256k1_pubkey *local_38;
  
  if (secnonce == (secp256k1_musig_secnonce *)0x0) {
    (*(ctx->illegal_callback).fn)("secnonce != NULL",(ctx->illegal_callback).data);
  }
  else {
    local_38 = pubkey;
    memset(secnonce,0,0x84);
    if (session_secrand32 == (uchar *)0x0) {
      (*(ctx->illegal_callback).fn)("session_secrand32 != NULL",(ctx->illegal_callback).data);
      return 0;
    }
    local_3c = secp256k1_is_zero_array(session_secrand32,0x20);
    local_3c = local_3c ^ 1;
    secp256k1_declassify(ctx,&local_3c,4);
    if (local_3c != 0) {
      uVar1 = secp256k1_musig_nonce_gen_internal
                        (ctx,secnonce,pubnonce,session_secrand32,seckey,local_38,msg32,keyagg_cache,
                         extra_input32);
      local_3c = uVar1 & local_3c;
      secp256k1_memczero(session_secrand32,0x20,local_3c);
      return local_3c;
    }
    secp256k1_musig_secnonce_invalidate(ctx,secnonce,1);
  }
  return 0;
}

Assistant:

int secp256k1_musig_nonce_gen(const secp256k1_context* ctx, secp256k1_musig_secnonce *secnonce, secp256k1_musig_pubnonce *pubnonce, unsigned char *session_secrand32, const unsigned char *seckey, const secp256k1_pubkey *pubkey, const unsigned char *msg32, const secp256k1_musig_keyagg_cache *keyagg_cache, const unsigned char *extra_input32) {
    int ret = 1;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(secnonce != NULL);
    memset(secnonce, 0, sizeof(*secnonce));
    ARG_CHECK(session_secrand32 != NULL);

    /* Check in constant time that the session_secrand32 is not 0 as a
     * defense-in-depth measure that may protect against a faulty RNG. */
    ret &= !secp256k1_is_zero_array(session_secrand32, 32);

    /* We can declassify because branching on ret is only relevant when this
     * function called with an invalid session_secrand32 argument */
    secp256k1_declassify(ctx, &ret, sizeof(ret));
    if (ret == 0) {
        secp256k1_musig_secnonce_invalidate(ctx, secnonce, 1);
        return 0;
    }

    ret &= secp256k1_musig_nonce_gen_internal(ctx, secnonce, pubnonce, session_secrand32, seckey, pubkey, msg32, keyagg_cache, extra_input32);

    /* Set the session_secrand32 buffer to zero to prevent the caller from using
     * nonce_gen multiple times with the same buffer. */
    secp256k1_memczero(session_secrand32, 32, ret);
    return ret;
}